

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::RenderPassCreateInfo::addAttachment
          (RenderPassCreateInfo *this,VkAttachmentDescription attachment)

{
  vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  *this_00;
  size_type sVar1;
  reference pvVar2;
  allocator<vk::VkAttachmentDescription> local_61;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  local_60;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  local_58;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> local_50;
  AttachmentDescription local_34;
  RenderPassCreateInfo *local_10;
  RenderPassCreateInfo *this_local;
  
  this_00 = &this->m_attachments;
  local_10 = this;
  AttachmentDescription::AttachmentDescription(&local_34,&attachment);
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  push_back(this_00,&local_34);
  local_58._M_current =
       (AttachmentDescription *)
       std::
       vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
       begin(this_00);
  local_60._M_current =
       (AttachmentDescription *)
       std::
       vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
       end(this_00);
  std::allocator<vk::VkAttachmentDescription>::allocator(&local_61);
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_50,local_58,local_60,&local_61);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::operator=
            (&this->m_attachmentsStructs,&local_50);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::~vector
            (&local_50);
  std::allocator<vk::VkAttachmentDescription>::~allocator(&local_61);
  sVar1 = std::
          vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
          ::size(&this->m_attachments);
  (this->super_VkRenderPassCreateInfo).attachmentCount = (deUint32)sVar1;
  pvVar2 = std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
           operator[](&this->m_attachmentsStructs,0);
  (this->super_VkRenderPassCreateInfo).pAttachments = pvVar2;
  return;
}

Assistant:

void
RenderPassCreateInfo::addAttachment (vk::VkAttachmentDescription attachment)
{

	m_attachments.push_back(attachment);
	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>(m_attachments.begin(), m_attachments.end());
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachmentsStructs[0];
}